

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::processQueryResponse(CoreBroker *this,ActionMessage *message)

{
  ushort uVar1;
  pointer ptVar2;
  long lVar3;
  long lVar4;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *pvVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int ii;
  long lVar9;
  long lVar10;
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *this_00;
  allocator<char> local_91;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *local_90;
  string str;
  string local_50;
  
  uVar1 = message->counter;
  if (uVar1 == 0) {
    iVar7 = message->messageID;
    local_50._M_dataplus._M_p = (pointer)(message->payload).bufferSize;
    local_50._M_string_length = (size_type)(message->payload).heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&str,(basic_string_view<char,_std::char_traits<char>_> *)&local_50,
               &local_91);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar7,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
  }
  else {
    ptVar2 = (this->mapBuilders).
             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (uint)uVar1;
    if (((uint)(((long)(this->mapBuilders).
                       super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2) / 0x60) & 0xffff)
        <= uVar8) {
      return;
    }
    local_90 = (vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               ((ulong)uVar8 * 0x60);
    this_00 = &ptVar2[uVar8].
               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
               .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
    local_50._M_dataplus._M_p = (pointer)(message->payload).bufferSize;
    local_50._M_string_length = (size_type)(message->payload).heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&str,(basic_string_view<char,_std::char_traits<char>_> *)&local_50,
               &local_91);
    bVar6 = fileops::JsonMapBuilder::addComponent
                      (&this_00->_M_head_impl,(string *)&str,message->messageID);
    std::__cxx11::string::~string((string *)&str);
    if (!bVar6) {
      return;
    }
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    if (message->counter == 8) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&str,"{\"status\":true}");
    }
    else {
      if (message->counter == 9) {
        generateGlobalStatus_abi_cxx11_(&local_50,this,&this_00->_M_head_impl);
      }
      else {
        fileops::JsonMapBuilder::generate_abi_cxx11_((string *)&local_50,&this_00->_M_head_impl);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&str,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pvVar5 = local_90;
    local_90 = (vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               ((long)&(ptVar2->
                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       ).
                       super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       .
                       super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
               + (long)local_90);
    lVar10 = 0;
    lVar9 = 0;
    while( true ) {
      lVar3 = *(long *)((long)&(ptVar2->
                               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               ).
                               super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               .
                               super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       + (long)pvVar5);
      lVar4 = *(long *)((long)&(ptVar2->
                               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               ).
                               super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               .
                               super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       + (long)pvVar5 + 8U);
      if ((int)((lVar4 - lVar3) / 0xb8) + -1 <= lVar9) break;
      if (*(int *)(lVar3 + 0x10 + lVar10) == (this->super_BrokerBase).global_broker_id_local.gid) {
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(&this->activeQueries,*(int *)(lVar3 + 4 + lVar10),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str)
        ;
      }
      else {
        SmallBuffer::operator=
                  ((SmallBuffer *)(lVar3 + lVar10 + 0x40),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
        routeMessage(this,(ActionMessage *)
                          ((long)(&(((local_90->
                                     super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->payload).buffer +
                                 0xffffffffffffffff) + lVar10));
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xb8;
    }
    if (*(int *)(lVar4 + -0xa8) == (this->super_BrokerBase).global_broker_id_local.gid) {
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(&this->activeQueries,*(int *)(lVar4 + -0xb4),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
    }
    else {
      SmallBuffer::operator=((SmallBuffer *)(lVar4 + -0x78),&str);
      routeMessage(this,(ActionMessage *)
                        (*(long *)((long)&(ptVar2->
                                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          ).
                                          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          .
                                          super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                  + (long)pvVar5 + 8U) + -0xb8));
    }
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear(local_90);
    if (*(char *)&(this->mapBuilders).
                  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[message->counter].
                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .
                  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .super__Tuple_impl<2UL,_helics::QueryReuse> == '\x01') {
      fileops::JsonMapBuilder::reset(&this_00->_M_head_impl);
    }
    else {
      iVar7 = generateMapObjectCounter(this);
      *(int *)((long)&(ptVar2->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl +
              (long)pvVar5 + 0x38U) = iVar7;
    }
  }
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void CoreBroker::processQueryResponse(const ActionMessage& message)
{
    if (message.counter == GENERAL_QUERY) {
        activeQueries.setDelayedValue(message.messageID, std::string(message.payload.to_string()));
        return;
    }
    if (isValidIndex(message.counter, mapBuilders)) {
        auto& builder = std::get<0>(mapBuilders[message.counter]);
        auto& requesters = std::get<1>(mapBuilders[message.counter]);
        if (builder.addComponent(std::string(message.payload.to_string()), message.messageID)) {
            std::string str;
            switch (message.counter) {
                case GLOBAL_STATUS:
                    str = generateGlobalStatus(builder);
                    break;
                case GLOBAL_FLUSH:
                    str = "{\"status\":true}";
                    break;
                default:
                    str = builder.generate();
                    break;
            }

            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(mapBuilders[message.counter]) == QueryReuse::DISABLED) {
                builder.reset();
            } else {
                builder.setCounterCode(generateMapObjectCounter());
            }
        }
    }
}